

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_tempo.c
# Opt level: O0

smf_tempo_t * smf_get_tempo_by_seconds(smf_t *smf,double seconds)

{
  smf_tempo_t *tempo;
  int i;
  double seconds_local;
  smf_t *smf_local;
  
  if (seconds < 0.0) {
    __assert_fail("seconds >= 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                  ,0x12f,"smf_tempo_t *smf_get_tempo_by_seconds(const smf_t *, double)");
  }
  if ((seconds != 0.0) || (NAN(seconds))) {
    if (smf->tempo_array == (GPtrArray *)0x0) {
      __assert_fail("smf->tempo_array != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x134,"smf_tempo_t *smf_get_tempo_by_seconds(const smf_t *, double)");
    }
    tempo._4_4_ = smf->tempo_array->len;
    do {
      tempo._4_4_ = tempo._4_4_ - 1;
      if ((int)tempo._4_4_ < 0) {
        return (smf_tempo_t *)0x0;
      }
      smf_local = (smf_t *)smf_get_tempo_by_number(smf,tempo._4_4_);
      if (smf_local == (smf_t *)0x0) {
        __assert_fail("tempo",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                      ,0x139,"smf_tempo_t *smf_get_tempo_by_seconds(const smf_t *, double)");
      }
    } while (seconds <= *(double *)&smf_local->frames_per_second);
  }
  else {
    smf_local = (smf_t *)smf_get_tempo_by_number(smf,0);
  }
  return (smf_tempo_t *)smf_local;
}

Assistant:

smf_tempo_t *
smf_get_tempo_by_seconds(const smf_t *smf, double seconds)
{
	int i;
	smf_tempo_t *tempo;

	assert(seconds >= 0.0);

	if (seconds == 0.0)
		return (smf_get_tempo_by_number(smf, 0));

	assert(smf->tempo_array != NULL);
	
	for (i = smf->tempo_array->len - 1; i >= 0; i--) {
		tempo = smf_get_tempo_by_number(smf, i);

		assert(tempo);
		if (tempo->time_seconds < seconds)
			return (tempo);
	}

	return (NULL);
}